

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_invokestatic(ExecutionEngine *this)

{
  byte bVar1;
  u2 index;
  cp_info *constantPool;
  ushort uVar2;
  int iVar3;
  VMStack *this_00;
  Frame *this_01;
  cp_info **ppcVar4;
  u1 *puVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  MethodArea *this_02;
  ClassRuntime *classRuntime;
  Frame *this_03;
  Frame *pFVar9;
  ostream *poVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  vector<Value,_std::allocator<Value>_> args;
  string methodName;
  Value value;
  string methodDescriptor;
  string className;
  stack<Value,_std::deque<Value,_std::allocator<Value>_>_> operandStackBackup;
  vector<Value,_std::allocator<Value>_> local_1b8;
  char *local_198;
  long local_190;
  char local_188 [16];
  Value local_178;
  undefined1 *local_168;
  long local_160;
  undefined1 local_158 [16];
  string local_148;
  vector<Value,_std::allocator<Value>_> local_128;
  string local_110;
  string local_f0;
  _Deque_base<Value,_std::allocator<Value>_> local_d0;
  _Deque_base<Value,_std::allocator<Value>_> local_80;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  Frame::backupOperandStack
            ((stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&local_80,this_01);
  ppcVar4 = Frame::getConstantPool(this_01);
  constantPool = *ppcVar4;
  puVar5 = Frame::getCode(this_01,this_01->pc);
  uVar6 = (ulong)(ushort)(*(ushort *)(puVar5 + 1) << 8 | *(ushort *)(puVar5 + 1) >> 8);
  if (constantPool[uVar6 - 1].tag != '\n') {
    __assert_fail("methodCP.tag == CONSTANT_Methodref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x100f,"void ExecutionEngine::i_invokestatic()");
  }
  uVar13 = (ulong)constantPool[uVar6 - 1].info.fieldref_info.name_and_type_index;
  pcVar7 = getFormattedConstant(constantPool,constantPool[uVar6 - 1].info.fieldref_info.class_index)
  ;
  std::__cxx11::string::string((string *)&local_148,pcVar7,(allocator *)&local_198);
  if (constantPool[uVar13 - 1].tag != '\f') {
    __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x1016,"void ExecutionEngine::i_invokestatic()");
  }
  index = constantPool[uVar13 - 1].info.fieldref_info.name_and_type_index;
  pcVar7 = getFormattedConstant
                     (constantPool,constantPool[uVar13 - 1].info.fieldref_info.class_index);
  std::__cxx11::string::string((string *)&local_198,pcVar7,(allocator *)&local_168);
  pcVar7 = getFormattedConstant(constantPool,index);
  std::__cxx11::string::string((string *)&local_168,pcVar7,(allocator *)&local_1b8);
  iVar3 = std::__cxx11::string::compare((char *)&local_148);
  if ((iVar3 != 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_198), iVar3 != 0)) {
    lVar8 = std::__cxx11::string::find((char *)&local_148,0x127541,0);
    if (lVar8 != -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Tentando invocar metodo estatico invalido: ",0x2b);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_198,local_190);
      std::endl<char,std::char_traits<char>>(poVar10);
      exit(1);
    }
    uVar11 = 1;
    uVar2 = 0;
    do {
      bVar1 = local_168[uVar11];
      if (bVar1 < 0x4c) {
        if ((bVar1 == 0x44) || (bVar1 == 0x4a)) {
          uVar2 = uVar2 + 2;
        }
        else {
          if (bVar1 == 0x29) goto LAB_001204d4;
LAB_001204ce:
          uVar2 = uVar2 + 1;
        }
      }
      else {
        if (bVar1 != 0x5b) {
          if (bVar1 == 0x4c) {
            do {
              uVar11 = uVar11 + 1;
            } while (local_168[uVar11] != ';');
          }
          goto LAB_001204ce;
        }
        uVar2 = uVar2 + 1;
        do {
          uVar11 = uVar11 + 1;
        } while (local_168[uVar11] == '[');
        if (local_168[uVar11] == 'L') {
          do {
            uVar11 = uVar11 + 1;
          } while (local_168[uVar11] != ';');
        }
      }
      uVar11 = uVar11 + 1;
    } while( true );
  }
LAB_0012067a:
  this_01->pc = this_01->pc + 3;
LAB_0012067d:
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  std::_Deque_base<Value,_std::allocator<Value>_>::~_Deque_base(&local_80);
  return;
LAB_001204d4:
  local_1b8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (Value *)0x0;
  local_1b8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (uVar2 != 0) {
    uVar12 = (uint)uVar2;
    do {
      local_178 = Frame::popTopOfOperandStack(this_01);
      if (local_178.type == PADDING) {
        std::vector<Value,_std::allocator<Value>_>::insert
                  (&local_1b8,
                   local_1b8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                   super__Vector_impl_data._M_start + 1,&local_178);
      }
      else {
        std::vector<Value,_std::allocator<Value>_>::insert
                  (&local_1b8,
                   (const_iterator)
                   local_1b8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_178);
      }
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  this_02 = MethodArea::getInstance();
  classRuntime = MethodArea::loadClassNamed(this_02,&local_148);
  this_03 = (Frame *)operator_new(0xb8);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_198,local_198 + local_190);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_168,local_168 + local_160);
  std::vector<Value,_std::allocator<Value>_>::vector(&local_128,&local_1b8);
  Frame::Frame(this_03,classRuntime,&local_f0,&local_110,&local_128);
  if (local_128.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  pFVar9 = VMStack::getTopFrame(this_00);
  if (pFVar9 == this_01) {
    VMStack::addFrame(this_00,this_03);
  }
  else {
    std::deque<Value,_std::allocator<Value>_>::deque
              ((deque<Value,_std::allocator<Value>_> *)&local_d0,
               (deque<Value,_std::allocator<Value>_> *)&local_80);
    Frame::setOperandStackFromBackup
              (this_01,(stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&local_d0);
    std::_Deque_base<Value,_std::allocator<Value>_>::~_Deque_base(&local_d0);
    Frame::~Frame(this_03);
    operator_delete(this_03);
  }
  if (local_1b8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_start != (Value *)0x0) {
    operator_delete(local_1b8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pFVar9 != this_01) goto LAB_0012067d;
  goto LAB_0012067a;
}

Assistant:

void ExecutionEngine::i_invokestatic() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    stack<Value> operandStackBackup = topFrame->backupOperandStack();
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t methodIndex = (byte1 << 8) | byte2;
    cp_info methodCP = constantPool[methodIndex-1];
    assert(methodCP.tag == CONSTANT_Methodref); // precisa referenciar um método

    CONSTANT_Methodref_info methodInfo = methodCP.info.methodref_info;

    string className = getFormattedConstant(constantPool, methodInfo.class_index);

    cp_info nameAndTypeCP = constantPool[methodInfo.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info methodNameAndType = nameAndTypeCP.info.nameAndType_info;

    string methodName = getFormattedConstant(constantPool, methodNameAndType.name_index);
    string methodDescriptor = getFormattedConstant(constantPool, methodNameAndType.descriptor_index);

    if (className == "java/lang/Object" && methodName == "registerNatives") {
        topFrame->pc += 3;
        return;
    }
    
    if (className.find("java/") != string::npos) {
        cerr << "Tentando invocar metodo estatico invalido: " << methodName << endl;
        exit(1);
    } else {
        uint16_t nargs = 0; // numero de argumentos contidos na pilha de operandos
        uint16_t i = 1; // pulando o primeiro '('
        while (methodDescriptor[i] != ')') {
            char baseType = methodDescriptor[i];
            if (baseType == 'D' || baseType == 'J') {
                nargs += 2;
            } else if (baseType == 'L') {
                nargs++;
                while (methodDescriptor[++i] != ';');
            } else if (baseType == '[') {
                nargs++;
                while (methodDescriptor[++i] == '[');
                if (methodDescriptor[i] == 'L') while (methodDescriptor[++i] != ';');
            } else {
                nargs++;
            }
            i++;
        }

        vector<Value> args;
        for (int i = 0; i < nargs; i++) {
            Value value = topFrame->popTopOfOperandStack();
            if (value.type == ValueType::PADDING) {
                args.insert(args.begin() + 1, value); // adicionando o padding após o valor double/long.
            } else {
                args.insert(args.begin(), value);
            }
        }

        MethodArea &methodArea = MethodArea::getInstance();
        ClassRuntime *classRuntime = methodArea.loadClassNamed(className);
        Frame *newFrame = new Frame(classRuntime, methodName, methodDescriptor, args);

        // se a stack frame mudou, é porque teve <clinit> adicionado, então terminar a execução da instrução para eles serem executados.
        if (stackFrame.getTopFrame() != topFrame) {
            topFrame->setOperandStackFromBackup(operandStackBackup);
            delete newFrame;
            return;
        }

        stackFrame.addFrame(newFrame);
    }

    topFrame->pc += 3;
}